

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_12f431b::deleteVariableWatchCallbackData(void *client_data)

{
  if (client_data != (void *)0x0) {
    std::__cxx11::string::~string((string *)((long)client_data + 8));
  }
  operator_delete(client_data,0x28);
  return;
}

Assistant:

void deleteVariableWatchCallbackData(void* client_data)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);
  delete data;
}